

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestImplicitOutputDupes::~ParserTestImplicitOutputDupes(ParserTestImplicitOutputDupes *this)

{
  ParserTestImplicitOutputDupes *this_local;
  
  ~ParserTestImplicitOutputDupes(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

TEST_F(ParserTest, ImplicitOutputDupes) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build foo foo foo | foo foo foo foo: cat bar\n"));

  Edge* edge = state.LookupNode("foo")->in_edge();
  ASSERT_EQ(edge->outputs_.size(), 1);
  EXPECT_FALSE(edge->is_implicit_out(0));
}